

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.cc
# Opt level: O0

void __thiscall google::LogMessage::RecordCrashReason(LogMessage *this,CrashReason *reason)

{
  int iVar1;
  undefined8 *in_RSI;
  int unaff_retaddr;
  int unaff_retaddr_00;
  
  *in_RSI = DAT_00164520;
  *(undefined4 *)(in_RSI + 1) = DAT_0016449c;
  in_RSI[2] = DAT_00164500 + 0x15ce04;
  iVar1 = GetStackTrace(&reason->filename,unaff_retaddr_00,unaff_retaddr);
  *(int *)(in_RSI + 0x23) = iVar1;
  return;
}

Assistant:

void LogMessage::RecordCrashReason(
    glog_internal_namespace_::CrashReason* reason) {
  reason->filename = fatal_msg_data_exclusive.fullname_;
  reason->line_number = fatal_msg_data_exclusive.line_;
  reason->message = fatal_msg_data_exclusive.message_text_ +
                    fatal_msg_data_exclusive.num_prefix_chars_;
#ifdef HAVE_STACKTRACE
  // Retrieve the stack trace, omitting the logging frames that got us here.
  reason->depth = GetStackTrace(reason->stack, ARRAYSIZE(reason->stack), 4);
#else
  reason->depth = 0;
#endif
}